

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::PoolingParameter::PoolingParameter(PoolingParameter *this)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__PoolingParameter_007615b0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = 0;
  if (this != (PoolingParameter *)&_PoolingParameter_default_instance_) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  *(undefined8 *)((long)&this->stride_w_ + 1) = 0;
  *(undefined8 *)((long)&this->pad_w_ + 1) = 0;
  this->kernel_h_ = 0;
  this->kernel_w_ = 0;
  this->stride_h_ = 0;
  this->stride_w_ = 0;
  this->_cached_size_ = 0;
  this->pool_ = 0;
  this->kernel_size_ = 0;
  this->pad_ = 0;
  this->stride_ = 1;
  return;
}

Assistant:

PoolingParameter::PoolingParameter()
  : ::google::protobuf::Message(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_caffe_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:caffe.PoolingParameter)
}